

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

void __thiscall
duckdb::Serializer::WritePropertyWithDefault<duckdb::shared_ptr<duckdb::BoundParameterData,true>>
          (Serializer *this,field_id_t field_id,char *tag,
          shared_ptr<duckdb::BoundParameterData,_true> *value)

{
  byte bVar1;
  
  bVar1 = (value->internal).
          super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0 | (this->options).serialize_default_values;
  if (bVar1 == 0) {
    (*this->_vptr_Serializer[4])(this,field_id,tag,0);
  }
  else {
    (*this->_vptr_Serializer[4])(this,field_id,tag,1);
    WriteValue<duckdb::BoundParameterData>
              (this,(value->internal).
                    super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  (*this->_vptr_Serializer[5])(this,(ulong)bVar1);
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const T &value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && SerializationDefaultValue::IsDefault<T>(value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value);
		OnOptionalPropertyEnd(true);
	}